

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_result ma_channel_converter_process_pcm_frames
                    (ma_channel_converter *pConverter,void *pFramesOut,void *pFramesIn,
                    ma_uint64 frameCount)

{
  byte *pbVar1;
  char cVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  size_t sVar6;
  undefined4 uVar7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  ma_uint64 mVar12;
  undefined1 uVar13;
  short sVar14;
  int iVar15;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  undefined2 uVar19;
  uint uVar20;
  long lVar21;
  short sVar22;
  ulong uVar23;
  byte *pbVar24;
  undefined4 uVar25;
  float fVar26;
  
  if (pFramesOut == (void *)0x0 || pConverter == (ma_channel_converter *)0x0) {
    return MA_INVALID_ARGS;
  }
  if (pFramesIn == (void *)0x0) {
    if (pFramesOut == (void *)0x0) {
      return MA_SUCCESS;
    }
    sVar6 = ((&DAT_0019eb10)[pConverter->format] * pConverter->channelsOut) * frameCount;
    if (sVar6 == 0) {
      return MA_SUCCESS;
    }
    memset(pFramesOut,0,sVar6);
    return MA_SUCCESS;
  }
  switch(pConverter->conversionPath) {
  case ma_channel_conversion_path_passthrough:
    memcpy(pFramesOut,pFramesIn,
           ((&DAT_0019eb10)[pConverter->format] * pConverter->channelsOut) * frameCount);
    break;
  case ma_channel_conversion_path_mono_out:
    switch(pConverter->format) {
    case ma_format_u8:
      if (frameCount != 0) {
        mVar12 = 0;
        do {
          uVar16 = (ulong)pConverter->channelsIn;
          uVar3 = 0;
          if (uVar16 != 0) {
            uVar23 = 0;
            uVar3 = 0;
            do {
              uVar3 = (uVar3 + *(byte *)((long)pFramesIn + uVar23 + mVar12 * uVar16)) - 0x80;
              uVar23 = uVar23 + 1;
            } while (uVar16 != uVar23);
          }
          uVar3 = uVar3 / pConverter->channelsOut;
          if (0x7e < (int)uVar3) {
            uVar3 = 0x7f;
          }
          cVar2 = (char)uVar3;
          if ((int)uVar3 < -0x7f) {
            cVar2 = -0x80;
          }
          *(char *)((long)pFramesOut + mVar12) = cVar2 + -0x80;
          mVar12 = mVar12 + 1;
        } while (mVar12 != frameCount);
        return MA_SUCCESS;
      }
      break;
    case ma_format_s16:
      if (frameCount != 0) {
        uVar3 = pConverter->channelsIn;
        uVar16 = (ulong)uVar3;
        mVar12 = 0;
        do {
          uVar5 = 0;
          if (uVar16 != 0) {
            uVar23 = 0;
            uVar5 = 0;
            do {
              uVar5 = uVar5 + (int)*(short *)((long)pFramesIn + uVar23 * 2);
              uVar23 = uVar23 + 1;
            } while (uVar16 != uVar23);
          }
          *(short *)((long)pFramesOut + mVar12 * 2) = (short)(uVar5 / uVar3);
          mVar12 = mVar12 + 1;
          pFramesIn = (void *)((long)pFramesIn + uVar16 * 2);
        } while (mVar12 != frameCount);
        return MA_SUCCESS;
      }
      break;
    case ma_format_s24:
      if (frameCount != 0) {
        lVar11 = 0;
        mVar12 = 0;
        do {
          uVar16 = (ulong)pConverter->channelsIn;
          if (uVar16 == 0) {
            lVar10 = 0;
          }
          else {
            lVar18 = lVar11 * uVar16;
            lVar21 = 0;
            lVar10 = 0;
            do {
              lVar10 = lVar10 + ((long)((ulong)*(byte *)((long)pFramesIn + lVar21 + lVar18 + 2) <<
                                        0x38 | (ulong)*(byte *)((long)pFramesIn +
                                                               lVar21 + lVar18 + 1) << 0x30 |
                                               (ulong)*(byte *)((long)pFramesIn + lVar21 + lVar18)
                                               << 0x28) >> 0x28);
              lVar21 = lVar21 + 3;
            } while (uVar16 * 3 != lVar21);
          }
          lVar10 = lVar10 / (long)uVar16;
          lVar18 = mVar12 * 3;
          *(char *)((long)pFramesOut + lVar18) = (char)lVar10;
          *(char *)((long)pFramesOut + lVar18 + 1) = (char)((ulong)lVar10 >> 8);
          *(char *)((long)pFramesOut + lVar18 + 2) = (char)((ulong)lVar10 >> 0x10);
          mVar12 = mVar12 + 1;
          lVar11 = lVar11 + 3;
        } while (mVar12 != frameCount);
        return MA_SUCCESS;
      }
      break;
    case ma_format_s32:
      if (frameCount != 0) {
        lVar11 = 0;
        mVar12 = 0;
        do {
          uVar16 = (ulong)pConverter->channelsIn;
          if (uVar16 == 0) {
            lVar10 = 0;
          }
          else {
            uVar23 = 0;
            lVar10 = 0;
            do {
              lVar10 = lVar10 + *(int *)((long)pFramesIn + uVar23 * 4 + lVar11 * uVar16);
              uVar23 = uVar23 + 1;
            } while (uVar16 != uVar23);
          }
          *(int *)((long)pFramesOut + mVar12 * 4) = (int)(lVar10 / (long)uVar16);
          mVar12 = mVar12 + 1;
          lVar11 = lVar11 + 4;
        } while (mVar12 != frameCount);
        return MA_SUCCESS;
      }
      break;
    case ma_format_f32:
      if (frameCount != 0) {
        uVar16 = (ulong)pConverter->channelsIn;
        mVar12 = 0;
        do {
          fVar26 = 0.0;
          if (uVar16 != 0) {
            uVar23 = 0;
            do {
              fVar26 = fVar26 + *(float *)((long)pFramesIn + uVar23 * 4);
              uVar23 = uVar23 + 1;
            } while (uVar16 != uVar23);
          }
          *(float *)((long)pFramesOut + mVar12 * 4) = fVar26 / (float)uVar16;
          mVar12 = mVar12 + 1;
          pFramesIn = (void *)((long)pFramesIn + uVar16 * 4);
        } while (mVar12 != frameCount);
        return MA_SUCCESS;
      }
      break;
    default:
LAB_00163f88:
      return MA_INVALID_OPERATION;
    }
    break;
  case ma_channel_conversion_path_mono_in:
    switch(pConverter->format) {
    case ma_format_u8:
      if (frameCount != 0) {
        mVar12 = 0;
        do {
          uVar16 = (ulong)pConverter->channelsOut;
          if (pConverter->channelsOut != 0) {
            uVar23 = 0;
            do {
              *(undefined1 *)((long)pFramesOut + uVar23 + uVar16 * mVar12) =
                   *(undefined1 *)((long)pFramesIn + mVar12);
              uVar23 = uVar23 + 1;
              uVar16 = (ulong)pConverter->channelsOut;
            } while (uVar23 < uVar16);
          }
          mVar12 = mVar12 + 1;
        } while (mVar12 != frameCount);
        return MA_SUCCESS;
      }
      break;
    case ma_format_s16:
      uVar16 = (ulong)pConverter->channelsOut;
      if (uVar16 == 2) {
        if (frameCount != 0) {
          mVar12 = 0;
          do {
            *(undefined2 *)((long)pFramesOut + mVar12 * 4) =
                 *(undefined2 *)((long)pFramesIn + mVar12 * 2);
            *(undefined2 *)((long)pFramesOut + mVar12 * 4 + 2) =
                 *(undefined2 *)((long)pFramesIn + mVar12 * 2);
            mVar12 = mVar12 + 1;
          } while (frameCount != mVar12);
          return MA_SUCCESS;
        }
      }
      else if (frameCount != 0) {
        mVar12 = 0;
        do {
          if (uVar16 != 0) {
            uVar23 = 0;
            do {
              *(undefined2 *)((long)pFramesOut + uVar23 * 2) =
                   *(undefined2 *)((long)pFramesIn + mVar12 * 2);
              uVar23 = uVar23 + 1;
            } while (uVar16 != uVar23);
          }
          mVar12 = mVar12 + 1;
          pFramesOut = (void *)((long)pFramesOut + uVar16 * 2);
        } while (mVar12 != frameCount);
        return MA_SUCCESS;
      }
      break;
    case ma_format_s24:
      if (frameCount != 0) {
        mVar12 = 0;
        do {
          uVar16 = (ulong)pConverter->channelsOut;
          if (pConverter->channelsOut != 0) {
            lVar11 = mVar12 * 3;
            uVar23 = 0;
            do {
              lVar10 = (uVar16 * mVar12 + uVar23) * 3;
              *(undefined1 *)((long)pFramesOut + lVar10) = *(undefined1 *)((long)pFramesIn + lVar11)
              ;
              *(undefined1 *)((long)pFramesOut + lVar10 + 1) =
                   *(undefined1 *)((long)pFramesIn + lVar11 + 1);
              *(undefined1 *)((long)pFramesOut + lVar10 + 2) =
                   *(undefined1 *)((long)pFramesIn + lVar11 + 2);
              uVar23 = uVar23 + 1;
              uVar16 = (ulong)pConverter->channelsOut;
            } while (uVar23 < uVar16);
          }
          mVar12 = mVar12 + 1;
        } while (mVar12 != frameCount);
        return MA_SUCCESS;
      }
      break;
    case ma_format_s32:
      if (frameCount != 0) {
        lVar11 = 0;
        mVar12 = 0;
        do {
          uVar16 = (ulong)pConverter->channelsOut;
          if (pConverter->channelsOut != 0) {
            uVar23 = 0;
            do {
              *(undefined4 *)((long)pFramesOut + uVar23 * 4 + uVar16 * lVar11) =
                   *(undefined4 *)((long)pFramesIn + mVar12 * 4);
              uVar23 = uVar23 + 1;
              uVar16 = (ulong)pConverter->channelsOut;
            } while (uVar23 < uVar16);
          }
          mVar12 = mVar12 + 1;
          lVar11 = lVar11 + 4;
        } while (mVar12 != frameCount);
        return MA_SUCCESS;
      }
      break;
    case ma_format_f32:
      uVar16 = (ulong)pConverter->channelsOut;
      if (uVar16 == 2) {
        if (frameCount != 0) {
          mVar12 = 0;
          do {
            *(undefined4 *)((long)pFramesOut + mVar12 * 8) =
                 *(undefined4 *)((long)pFramesIn + mVar12 * 4);
            *(undefined4 *)((long)pFramesOut + mVar12 * 8 + 4) =
                 *(undefined4 *)((long)pFramesIn + mVar12 * 4);
            mVar12 = mVar12 + 1;
          } while (frameCount != mVar12);
          return MA_SUCCESS;
        }
      }
      else if (frameCount != 0) {
        mVar12 = 0;
        do {
          if (uVar16 != 0) {
            uVar23 = 0;
            do {
              *(undefined4 *)((long)pFramesOut + uVar23 * 4) =
                   *(undefined4 *)((long)pFramesIn + mVar12 * 4);
              uVar23 = uVar23 + 1;
            } while (uVar16 != uVar23);
          }
          mVar12 = mVar12 + 1;
          pFramesOut = (void *)((long)pFramesOut + uVar16 * 4);
        } while (mVar12 != frameCount);
        return MA_SUCCESS;
      }
      break;
    default:
      goto LAB_00163f88;
    }
    break;
  case ma_channel_conversion_path_shuffle:
    uVar3 = pConverter->channelsOut;
    uVar16 = (ulong)uVar3;
    pbVar1 = pConverter->pShuffleTable;
    if (pbVar1 == (byte *)0x0 || uVar16 == 0) {
      return MA_INVALID_ARGS;
    }
    if (4 < pConverter->format - ma_format_u8) {
      return MA_INVALID_ARGS;
    }
    uVar5 = pConverter->channelsIn;
    uVar23 = (ulong)uVar5;
    switch(pConverter->format) {
    case ma_format_u8:
      if (frameCount != 0) {
        mVar12 = 0;
        do {
          uVar9 = 0;
          do {
            if (pbVar1[uVar9] < uVar5) {
              uVar13 = *(undefined1 *)((long)pFramesIn + (ulong)pbVar1[uVar9]);
            }
            else {
              uVar13 = 0;
            }
            *(undefined1 *)((long)pFramesOut + uVar9) = uVar13;
            uVar9 = uVar9 + 1;
          } while (uVar16 != uVar9);
          pFramesOut = (void *)((long)pFramesOut + uVar16);
          pFramesIn = (void *)((long)pFramesIn + uVar23);
          mVar12 = mVar12 + 1;
        } while (mVar12 != frameCount);
        return MA_SUCCESS;
      }
      break;
    case ma_format_s16:
      if (frameCount != 0) {
        mVar12 = 0;
        do {
          uVar9 = 0;
          do {
            if (pbVar1[uVar9] < uVar5) {
              uVar19 = *(undefined2 *)((long)pFramesIn + (ulong)pbVar1[uVar9] * 2);
            }
            else {
              uVar19 = 0;
            }
            *(undefined2 *)((long)pFramesOut + uVar9 * 2) = uVar19;
            uVar9 = uVar9 + 1;
          } while (uVar16 != uVar9);
          pFramesIn = (void *)((long)pFramesIn + uVar23 * 2);
          mVar12 = mVar12 + 1;
          pFramesOut = (void *)((long)pFramesOut + uVar16 * 2);
        } while (mVar12 != frameCount);
        return MA_SUCCESS;
      }
      break;
    case ma_format_s24:
      if (frameCount != 0) {
        mVar12 = 0;
        do {
          uVar20 = 2;
          uVar23 = 1;
          uVar9 = 0;
          pbVar24 = pbVar1;
          do {
            if (*pbVar24 < uVar5) {
              lVar11 = (ulong)*pbVar24 * 3;
              *(undefined1 *)((long)pFramesOut + (uVar9 & 0xffffffff)) =
                   *(undefined1 *)((long)pFramesIn + lVar11);
              *(undefined1 *)((long)pFramesOut + (uVar23 & 0xffffffff)) =
                   *(undefined1 *)((long)pFramesIn + lVar11 + 1);
              uVar13 = *(undefined1 *)((long)pFramesIn + lVar11 + 2);
              uVar17 = (ulong)uVar20;
            }
            else {
              uVar17 = uVar9 & 0xffffffff;
              uVar13 = 0;
            }
            *(undefined1 *)((long)pFramesOut + uVar17) = uVar13;
            *(undefined1 *)((long)pFramesOut + (uVar23 & 0xffffffff)) = 0;
            uVar20 = uVar20 + 3;
            uVar23 = uVar23 + 3;
            uVar9 = uVar9 + 3;
            pbVar24 = pbVar24 + 1;
          } while (uVar16 * 3 != uVar9);
          *(undefined1 *)((long)pFramesOut + (ulong)uVar20) = 0;
          pFramesOut = (void *)((long)pFramesOut + (ulong)(uVar3 * 3));
          pFramesIn = (void *)((long)pFramesIn + (ulong)(uVar5 * 3));
          mVar12 = mVar12 + 1;
        } while (mVar12 != frameCount);
        return MA_SUCCESS;
      }
      break;
    case ma_format_s32:
      if (frameCount != 0) {
        mVar12 = 0;
        do {
          uVar9 = 0;
          do {
            uVar25 = 0;
            if (pbVar1[uVar9] < uVar5) {
              uVar25 = *(undefined4 *)((long)pFramesIn + (ulong)pbVar1[uVar9] * 4);
            }
            *(undefined4 *)((long)pFramesOut + uVar9 * 4) = uVar25;
            uVar9 = uVar9 + 1;
          } while (uVar16 != uVar9);
          pFramesIn = (void *)((long)pFramesIn + uVar23 * 4);
          mVar12 = mVar12 + 1;
          pFramesOut = (void *)((long)pFramesOut + uVar16 * 4);
        } while (mVar12 != frameCount);
        return MA_SUCCESS;
      }
      break;
    case ma_format_f32:
      if (frameCount != 0) {
        mVar12 = 0;
        do {
          uVar9 = 0;
          do {
            uVar25 = 0;
            if (pbVar1[uVar9] < uVar5) {
              uVar25 = *(undefined4 *)((long)pFramesIn + (ulong)pbVar1[uVar9] * 4);
            }
            *(undefined4 *)((long)pFramesOut + uVar9 * 4) = uVar25;
            uVar9 = uVar9 + 1;
          } while (uVar16 != uVar9);
          pFramesIn = (void *)((long)pFramesIn + uVar23 * 4);
          mVar12 = mVar12 + 1;
          pFramesOut = (void *)((long)pFramesOut + uVar16 * 4);
        } while (mVar12 != frameCount);
        return MA_SUCCESS;
      }
    }
    break;
  default:
    if ((pFramesOut != (void *)0x0) &&
       (sVar6 = ((&DAT_0019eb10)[pConverter->format] * pConverter->channelsOut) * frameCount,
       sVar6 != 0)) {
      memset(pFramesOut,0,sVar6);
    }
    switch(pConverter->format) {
    case ma_format_u8:
      if (frameCount != 0) {
        uVar16 = 0;
        do {
          iVar4 = (int)uVar16;
          if (pConverter->channelsIn != 0) {
            uVar16 = 0;
            do {
              uVar23 = (ulong)pConverter->channelsOut;
              if (pConverter->channelsOut != 0) {
                uVar9 = 0;
                do {
                  uVar23 = (ulong)(uint)((int)uVar23 * iVar4 + (int)uVar9);
                  iVar15 = ((int)((*(byte *)((long)pFramesIn +
                                            (ulong)(pConverter->channelsIn * iVar4 + (int)uVar16)) -
                                  0x80) * (int)(pConverter->weights).f32[uVar16][uVar9]) >> 0xc) +
                           (uint)*(byte *)((long)pFramesOut + uVar23);
                  iVar8 = iVar15 + -0x80;
                  sVar22 = -0x80;
                  if (-0x81 < iVar8) {
                    sVar22 = 0x7f;
                  }
                  sVar14 = (short)iVar8;
                  if (iVar15 - 0xffU < 0xffffff01) {
                    sVar14 = sVar22;
                  }
                  if (0x7e < sVar14) {
                    sVar14 = 0x7f;
                  }
                  if (sVar14 < -0x7f) {
                    sVar14 = -0x80;
                  }
                  *(char *)((long)pFramesOut + uVar23) = (char)sVar14 + -0x80;
                  uVar9 = uVar9 + 1;
                  uVar23 = (ulong)pConverter->channelsOut;
                } while (uVar9 < uVar23);
              }
              uVar16 = uVar16 + 1;
            } while (uVar16 < pConverter->channelsIn);
          }
          uVar16 = (ulong)(iVar4 + 1);
        } while (uVar16 < frameCount);
        return MA_SUCCESS;
      }
      break;
    case ma_format_s16:
      if (frameCount != 0) {
        uVar3 = pConverter->channelsIn;
        uVar16 = 0;
        do {
          iVar4 = (int)uVar16;
          if ((ulong)uVar3 != 0) {
            uVar5 = pConverter->channelsOut;
            uVar16 = 0;
            do {
              if ((ulong)uVar5 != 0) {
                uVar23 = 0;
                do {
                  uVar9 = (ulong)(uVar5 * iVar4 + (int)uVar23);
                  iVar8 = ((int)*(short *)((long)pFramesIn +
                                          (ulong)(uVar3 * iVar4 + (int)uVar16) * 2) *
                           (int)(pConverter->weights).f32[uVar16][uVar23] >> 0xc) +
                          (int)*(short *)((long)pFramesOut + uVar9 * 2);
                  if (0x7ffe < iVar8) {
                    iVar8 = 0x7fff;
                  }
                  if (iVar8 < -0x7fff) {
                    iVar8 = -0x8000;
                  }
                  *(short *)((long)pFramesOut + uVar9 * 2) = (short)iVar8;
                  uVar23 = uVar23 + 1;
                } while (uVar5 != uVar23);
              }
              uVar16 = uVar16 + 1;
            } while (uVar16 != uVar3);
          }
          uVar16 = (ulong)(iVar4 + 1);
        } while (uVar16 < frameCount);
        return MA_SUCCESS;
      }
      break;
    case ma_format_s24:
      if (frameCount != 0) {
        uVar16 = 0;
        do {
          iVar4 = (int)uVar16;
          if (pConverter->channelsIn != 0) {
            uVar16 = 0;
            do {
              uVar23 = (ulong)pConverter->channelsOut;
              if (pConverter->channelsOut != 0) {
                uVar9 = 0;
                do {
                  uVar23 = (ulong)(uint)(((int)uVar23 * iVar4 + (int)uVar9) * 3);
                  lVar10 = (long)((ulong)*(byte *)((long)pFramesOut + uVar23 + 2) << 0x38 |
                                 (ulong)*(byte *)((long)pFramesOut + uVar23 + 1) << 0x30 |
                                 (ulong)*(byte *)((long)pFramesOut + uVar23) << 0x28) >> 0x28;
                  uVar17 = (ulong)((pConverter->channelsIn * iVar4 + (int)uVar16) * 3);
                  lVar18 = (long)(int)(pConverter->weights).f32[uVar16][uVar9] *
                           ((long)((ulong)*(byte *)((long)pFramesIn + uVar17 + 2) << 0x38 |
                                  (ulong)*(byte *)((long)pFramesIn + uVar17 + 1) << 0x30 |
                                  (ulong)*(byte *)((long)pFramesIn + uVar17) << 0x28) >> 0x28) >>
                           0xc;
                  lVar11 = lVar18 + lVar10;
                  uVar25 = 0xff800000;
                  if (-0x800001 < lVar11) {
                    uVar25 = 0x7fffff;
                  }
                  uVar7 = (int)lVar11;
                  if ((lVar10 + lVar18) - 0x7fffffU < 0xffffffffff000001) {
                    uVar7 = uVar25;
                  }
                  *(char *)((long)pFramesOut + uVar23) = (char)uVar7;
                  *(char *)((long)pFramesOut + uVar23 + 1) = (char)((uint)uVar7 >> 8);
                  *(char *)((long)pFramesOut + uVar23 + 2) = (char)((uint)uVar7 >> 0x10);
                  uVar9 = uVar9 + 1;
                  uVar23 = (ulong)pConverter->channelsOut;
                } while (uVar9 < uVar23);
              }
              uVar16 = uVar16 + 1;
            } while (uVar16 < pConverter->channelsIn);
          }
          uVar16 = (ulong)(iVar4 + 1);
        } while (uVar16 < frameCount);
        return MA_SUCCESS;
      }
      break;
    case ma_format_s32:
      if (frameCount != 0) {
        uVar16 = 0;
        do {
          iVar4 = (int)uVar16;
          if (pConverter->channelsIn != 0) {
            uVar16 = 0;
            do {
              uVar23 = (ulong)pConverter->channelsOut;
              if (pConverter->channelsOut != 0) {
                uVar9 = 0;
                do {
                  uVar23 = (ulong)(uint)((int)uVar23 * iVar4 + (int)uVar9);
                  lVar11 = ((long)(int)(pConverter->weights).f32[uVar16][uVar9] *
                            (long)*(int *)((long)pFramesIn +
                                          (ulong)(pConverter->channelsIn * iVar4 + (int)uVar16) * 4)
                           >> 0xc) + (long)*(int *)((long)pFramesOut + uVar23 * 4);
                  if (0x7ffffffe < lVar11) {
                    lVar11 = 0x7fffffff;
                  }
                  if (lVar11 < -0x7fffffff) {
                    lVar11 = -0x80000000;
                  }
                  *(int *)((long)pFramesOut + uVar23 * 4) = (int)lVar11;
                  uVar9 = uVar9 + 1;
                  uVar23 = (ulong)pConverter->channelsOut;
                } while (uVar9 < uVar23);
              }
              uVar16 = uVar16 + 1;
            } while (uVar16 < pConverter->channelsIn);
          }
          uVar16 = (ulong)(iVar4 + 1);
        } while (uVar16 < frameCount);
        return MA_SUCCESS;
      }
      break;
    case ma_format_f32:
      if (frameCount != 0) {
        uVar3 = pConverter->channelsIn;
        uVar16 = 0;
        do {
          iVar4 = (int)uVar16;
          if ((ulong)uVar3 != 0) {
            uVar5 = pConverter->channelsOut;
            uVar16 = 0;
            do {
              if ((ulong)uVar5 != 0) {
                uVar23 = 0;
                do {
                  uVar9 = (ulong)(uVar5 * iVar4 + (int)uVar23);
                  *(float *)((long)pFramesOut + uVar9 * 4) =
                       *(float *)((long)pFramesIn + (ulong)(iVar4 * uVar3 + (int)uVar16) * 4) *
                       (pConverter->weights).f32[uVar16][uVar23] +
                       *(float *)((long)pFramesOut + uVar9 * 4);
                  uVar23 = uVar23 + 1;
                } while (uVar5 != uVar23);
              }
              uVar16 = uVar16 + 1;
            } while (uVar16 != uVar3);
          }
          uVar16 = (ulong)(iVar4 + 1);
        } while (uVar16 < frameCount);
        return MA_SUCCESS;
      }
      break;
    default:
      goto LAB_00163f88;
    }
  }
  return MA_SUCCESS;
}

Assistant:

MA_API ma_result ma_channel_converter_process_pcm_frames(ma_channel_converter* pConverter, void* pFramesOut, const void* pFramesIn, ma_uint64 frameCount)
{
    if (pConverter == NULL) {
        return MA_INVALID_ARGS;
    }

    if (pFramesOut == NULL) {
        return MA_INVALID_ARGS;
    }

    if (pFramesIn == NULL) {
        ma_zero_memory_64(pFramesOut, frameCount * ma_get_bytes_per_frame(pConverter->format, pConverter->channelsOut));
        return MA_SUCCESS;
    }

    switch (pConverter->conversionPath)
    {
        case ma_channel_conversion_path_passthrough: return ma_channel_converter_process_pcm_frames__passthrough(pConverter, pFramesOut, pFramesIn, frameCount);
        case ma_channel_conversion_path_mono_out:    return ma_channel_converter_process_pcm_frames__mono_out(pConverter, pFramesOut, pFramesIn, frameCount);
        case ma_channel_conversion_path_mono_in:     return ma_channel_converter_process_pcm_frames__mono_in(pConverter, pFramesOut, pFramesIn, frameCount);
        case ma_channel_conversion_path_shuffle:     return ma_channel_converter_process_pcm_frames__shuffle(pConverter, pFramesOut, pFramesIn, frameCount);
        case ma_channel_conversion_path_weights:
        default:
        {
            return ma_channel_converter_process_pcm_frames__weights(pConverter, pFramesOut, pFramesIn, frameCount);
        }
    }
}